

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_getmetatable(jit_State *J,RecordFFData *rd)

{
  int iVar1;
  RecordIndex ix;
  TValue local_50 [6];
  TRef local_20;
  TRef aTStack_14 [3];
  
  local_20 = *J->base;
  if (local_20 != 0) {
    local_50[0] = *rd->argv;
    iVar1 = lj_record_mm_lookup(J,(RecordIndex *)&local_50[0].gcr,MM_metatable);
    *J->base = aTStack_14[iVar1 != 0];
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_getmetatable(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (tr) {
    RecordIndex ix;
    ix.tab = tr;
    copyTV(J->L, &ix.tabv, &rd->argv[0]);
    if (lj_record_mm_lookup(J, &ix, MM_metatable))
      J->base[0] = ix.mobj;
    else
      J->base[0] = ix.mt;
  }  /* else: Interpreter will throw. */
}